

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_01;
  RepeatedField<int> *this_02;
  RepeatedField<int> *this_03;
  Tables *pTVar1;
  DescriptorPool *this_04;
  FileDescriptorTables *pFVar2;
  Message *descriptor;
  MessageLite *this_05;
  pointer pOVar3;
  long *plVar4;
  long lVar5;
  undefined8 this_06;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  SourceCodeInfo *this_07;
  FileDescriptorTables *pFVar10;
  string *psVar11;
  void *pvVar12;
  GoogleOnceDynamic *pGVar13;
  int *piVar14;
  Type *pTVar15;
  const_iterator cVar16;
  const_iterator cVar17;
  Type *pTVar18;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  pointer pOVar19;
  undefined4 extraout_var;
  FieldDescriptor *pFVar20;
  LogMessage *pLVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DescriptorPool *pDVar22;
  undefined8 *puVar23;
  FileDescriptorTables *pFVar24;
  void *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  FileDescriptor *pFVar25;
  int iVar26;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  FileDescriptorTables *pFVar27;
  FileDescriptorTables *pFVar28;
  long lVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  pointer pOVar31;
  int i;
  long lVar32;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar33;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar34;
  FileDescriptor *dependency;
  string buf;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  FileDescriptor *local_160;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  string local_110;
  undefined1 local_f0 [16];
  undefined1 auStack_e0 [48];
  size_type *local_b0 [2];
  size_type local_a0 [2];
  undefined1 local_90 [16];
  FileDescriptorTables *local_80;
  FileDescriptorTables *local_78;
  FileDescriptorTables *local_70;
  _Base_ptr local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  local_160 = (FileDescriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xc0);
  this->file_ = local_160;
  local_160[0x90] = (FileDescriptor)0x0;
  local_160[0xb8] = (FileDescriptor)0x0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    this_07 = SourceCodeInfo::default_instance();
  }
  else {
    this_07 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    from = proto->source_code_info_;
    if (from == (SourceCodeInfo *)0x0) {
      from = (SourceCodeInfo *)&_SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_07,from);
  }
  *(SourceCodeInfo **)(local_160 + 0xb0) = this_07;
  pFVar10 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar10;
  *(FileDescriptorTables **)(this->file_ + 0xa8) = pFVar10;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    local_f0._8_8_ = (OptionsToInterpret *)0x0;
    auStack_e0._0_8_ = auStack_e0._0_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = (DescriptorBuilder *)auStack_e0;
    AddError(this,(string *)local_f0,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    if ((DescriptorBuilder *)local_f0._0_8_ != (DescriptorBuilder *)auStack_e0) {
      operator_delete((void *)local_f0._0_8_,(ulong)(auStack_e0._0_8_ + 1));
    }
  }
  psVar11 = (proto->syntax_).ptr_;
  if ((psVar11->_M_string_length == 0) ||
     (iVar8 = std::__cxx11::string::compare((char *)psVar11), iVar8 == 0)) {
    *(undefined4 *)(this->file_ + 0x8c) = 2;
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)(proto->syntax_).ptr_);
    if (iVar8 == 0) {
      *(undefined4 *)(this->file_ + 0x8c) = 3;
    }
    else {
      *(undefined4 *)(this->file_ + 0x8c) = 0;
      psVar11 = (proto->name_).ptr_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "Unrecognized syntax: ",(proto->syntax_).ptr_);
      AddError(this,psVar11,&proto->super_Message,OTHER,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      if ((DescriptorBuilder *)local_f0._0_8_ != (DescriptorBuilder *)auStack_e0) {
        operator_delete((void *)local_f0._0_8_,(ulong)(auStack_e0._0_8_ + 1));
      }
    }
  }
  psVar11 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)local_160 = psVar11;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    local_f0._8_8_ = (OptionsToInterpret *)0x0;
    auStack_e0._0_8_ = auStack_e0._0_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = (DescriptorBuilder *)auStack_e0;
    psVar11 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_f0);
    *(string **)(local_160 + 8) = psVar11;
    if ((DescriptorBuilder *)local_f0._0_8_ != (DescriptorBuilder *)auStack_e0) {
      operator_delete((void *)local_f0._0_8_,(ulong)(auStack_e0._0_8_ + 1));
    }
  }
  else {
    psVar11 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->package_).ptr_);
    *(string **)(local_160 + 8) = psVar11;
  }
  *(DescriptorPool **)(local_160 + 0x10) = this->pool_;
  bVar6 = DescriptorPool::Tables::AddFile(this->tables_,local_160);
  if (bVar6) {
    if ((*(string **)(local_160 + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(local_160 + 8),&proto->super_Message,local_160);
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar8 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_160 + 0x18) = iVar8;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 << 3);
    *(void **)(local_160 + 0x20) = pvVar12;
    if (this->pool_->lazily_build_dependencies_ == true) {
      pGVar13 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(GoogleOnceDynamic **)(local_160 + 0x30) = pGVar13;
      pvVar12 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,
                           (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
      *(void **)(local_160 + 0x28) = pvVar12;
      memset(pvVar12,0,(long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
    }
    else {
      *(undefined8 *)(local_160 + 0x28) = 0;
      *(undefined8 *)(local_160 + 0x30) = 0;
    }
    this_01 = &this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this_01->_M_t);
    pFVar10 = (FileDescriptorTables *)(local_90 + 8);
    local_90._8_4_ = _S_red;
    iVar8 = 0;
    local_80 = (FileDescriptorTables *)0x0;
    local_68 = (_Base_ptr)0x0;
    this_02 = &proto->weak_dependency_;
    local_78 = pFVar10;
    local_70 = pFVar10;
    if (0 < (proto->weak_dependency_).current_size_) {
      do {
        piVar14 = RepeatedField<int>::Get(this_02,iVar8);
        local_f0._0_4_ = *piVar14;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_90,(int *)local_f0);
        iVar8 = iVar8 + 1;
      } while (iVar8 < this_02->current_size_);
    }
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &proto->dependency_;
      lVar29 = 0;
      do {
        iVar8 = (int)lVar29;
        pTVar15 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar8);
        pVar33 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,pTVar15);
        if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          AddTwiceListedError(this,proto,iVar8);
        }
        pTVar1 = this->tables_;
        pTVar15 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar8);
        local_f0._0_8_ = (pTVar15->_M_dataplus)._M_p;
        cVar16 = std::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&pTVar1->files_by_name_,(key_type *)local_f0);
        if (cVar16.
            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_148._0_8_ = (FileDescriptor *)0x0;
LAB_002e0e04:
          pDVar22 = this->pool_;
          this_04 = pDVar22->underlay_;
          if (this_04 != (DescriptorPool *)0x0) {
            pTVar15 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_00->super_RepeatedPtrFieldBase,iVar8);
            local_148._0_8_ = DescriptorPool::FindFileByName(this_04,pTVar15);
            goto LAB_002e0e33;
          }
LAB_002e0ea4:
          if (pDVar22->allow_unknown_ == false) {
            pFVar2 = local_80;
            pFVar28 = pFVar10;
            if (local_80 != (FileDescriptorTables *)0x0 && pDVar22->enforce_weak_ == false) {
              do {
                pFVar27 = pFVar28;
                pFVar24 = pFVar2;
                lVar32 = (long)(int)(pFVar24->symbols_by_parent_).
                                    super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                                    ._M_h._M_rehash_policy._M_max_load_factor;
                pFVar28 = pFVar24;
                if (lVar32 < lVar29) {
                  pFVar28 = pFVar27;
                }
                pFVar2 = (FileDescriptorTables *)
                         (&(pFVar24->symbols_by_parent_).
                           super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                           ._M_h._M_before_begin)[lVar32 < lVar29]._M_nxt;
              } while (pFVar2 != (FileDescriptorTables *)0x0);
              if (pFVar28 != pFVar10) {
                if (lVar32 < lVar29) {
                  pFVar24 = pFVar27;
                }
                if ((int)(pFVar24->symbols_by_parent_).
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                         ._M_h._M_rehash_policy._M_max_load_factor <= lVar29) goto LAB_002e0eab;
              }
            }
            if (pDVar22->lazily_build_dependencies_ == false) {
              AddImportError(this,proto,iVar8);
            }
          }
          else {
LAB_002e0eab:
            pTVar15 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_00->super_RepeatedPtrFieldBase,iVar8);
            local_148._0_8_ = DescriptorPool::NewPlaceholderFileWithMutexHeld(pDVar22,pTVar15);
          }
        }
        else {
          local_148._0_8_ =
               *(undefined8 *)
                ((long)cVar16.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10);
          if ((FileDescriptor *)local_148._0_8_ == (FileDescriptor *)0x0) goto LAB_002e0e04;
LAB_002e0e33:
          if ((FileDescriptor *)local_148._0_8_ == local_160) {
            DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
            goto LAB_002e199c;
          }
          pDVar22 = this->pool_;
          if ((FileDescriptor *)local_148._0_8_ == (FileDescriptor *)0x0) goto LAB_002e0ea4;
          if (((pDVar22->enforce_dependencies_ == true) &&
              (cVar17 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&(pDVar22->unused_import_track_files_)._M_t,(proto->name_).ptr_),
              (_Rb_tree_header *)cVar17._M_node !=
              &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header)) &&
             (*(int *)(local_148._0_8_ + 0x38) == 0)) {
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)this_01,(FileDescriptor **)local_148);
          }
        }
        *(undefined8 *)(*(long *)(local_160 + 0x20) + lVar29 * 8) = local_148._0_8_;
        if (((FileDescriptor *)local_148._0_8_ == (FileDescriptor *)0x0 &
            this->pool_->lazily_build_dependencies_) == 1) {
          pTVar1 = this->tables_;
          pTVar15 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,iVar8);
          psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,pTVar15);
          *(string **)(*(long *)(local_160 + 0x28) + lVar29 * 8) = psVar11;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pvVar12 = DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->public_dependency_).current_size_ << 2);
    this_03 = &proto->public_dependency_;
    *(void **)(local_160 + 0x40) = pvVar12;
    if (this_03->current_size_ < 1) {
      iVar8 = 0;
    }
    else {
      iVar26 = 0;
      iVar8 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(this_03,iVar26);
        iVar9 = *piVar14;
        if (((long)iVar9 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar9)) {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar29 = (long)iVar8;
          iVar8 = iVar8 + 1;
          *(int *)(*(long *)(local_160 + 0x40) + lVar29 * 4) = iVar9;
          if (this->pool_->lazily_build_dependencies_ == false) {
            if (*(GoogleOnceDynamic **)(local_160 + 0x30) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                        (*(GoogleOnceDynamic **)(local_160 + 0x30),
                         FileDescriptor::DependenciesOnceInit,local_160);
            }
            local_f0._0_8_ = *(undefined8 *)(*(long *)(local_160 + 0x20) + (long)iVar9 * 8);
            pVar34 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ::equal_range(&this_01->_M_t,(key_type *)local_f0);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar34.first._M_node,
                           (_Base_ptr)pVar34.second._M_node);
          }
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 < this_03->current_size_);
    }
    *(int *)(local_160 + 0x38) = iVar8;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if ((this->pool_->lazily_build_dependencies_ == false) && (0 < *(int *)(local_160 + 0x18))) {
      lVar29 = 0;
      do {
        if (*(GoogleOnceDynamic **)(local_160 + 0x30) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                    (*(GoogleOnceDynamic **)(local_160 + 0x30),FileDescriptor::DependenciesOnceInit,
                     local_160);
        }
        RecordPublicDependencies
                  (this,*(FileDescriptor **)(*(long *)(local_160 + 0x20) + lVar29 * 8));
        lVar29 = lVar29 + 1;
      } while (lVar29 < *(int *)(local_160 + 0x18));
    }
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,this_02->current_size_ << 2);
    *(void **)(local_160 + 0x50) = pvVar12;
    if (this_02->current_size_ < 1) {
      iVar8 = 0;
    }
    else {
      iVar26 = 0;
      iVar8 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(this_02,iVar26);
        iVar9 = *piVar14;
        if ((iVar9 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar9))
        {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid weak dependency index.");
        }
        else {
          lVar29 = (long)iVar8;
          iVar8 = iVar8 + 1;
          *(int *)(*(long *)(local_160 + 0x50) + lVar29 * 4) = iVar9;
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 < this_02->current_size_);
    }
    *(int *)(local_160 + 0x48) = iVar8;
    iVar8 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_160 + 0x58) = iVar8;
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0xa8);
    *(void **)(local_160 + 0x60) = pvVar12;
    if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar29 = 0;
      lVar32 = 0;
      do {
        pTVar18 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar32);
        BuildMessage(this,pTVar18,(Descriptor *)0x0,
                     (Descriptor *)(*(long *)(local_160 + 0x60) + lVar29));
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 0xa8;
      } while (lVar32 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_160 + 0x68) = iVar8;
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x38);
    *(void **)(local_160 + 0x70) = pvVar12;
    if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar29 = 0;
      lVar32 = 0;
      do {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                             (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar32);
        BuildEnum(this,proto_00,(Descriptor *)0x0,
                  (EnumDescriptor *)(*(long *)(local_160 + 0x70) + lVar29));
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 0x38;
      } while (lVar32 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_160 + 0x78) = iVar8;
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0x30);
    *(void **)(local_160 + 0x80) = pvVar12;
    if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
      lVar29 = 0;
      lVar32 = 0;
      do {
        proto_01 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                             (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar32);
        BuildService(this,proto_01,extraout_RDX,
                     (ServiceDescriptor *)(*(long *)(local_160 + 0x80) + lVar29));
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 0x30;
      } while (lVar32 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar8 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_160 + 0x88) = iVar8;
    pvVar12 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar8 * 0xa8);
    *(void **)(local_160 + 0x98) = pvVar12;
    if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
      lVar29 = 0;
      lVar32 = 0;
      do {
        proto_02 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                             (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar32);
        BuildFieldOrExtension
                  (this,proto_02,(Descriptor *)0x0,
                   (FieldDescriptor *)(*(long *)(local_160 + 0x98) + lVar29),true);
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 0xa8;
      } while (lVar32 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      *(undefined8 *)(local_160 + 0xa0) = 0;
    }
    else {
      orig_options = proto->options_;
      if (orig_options == (FileOptions *)0x0) {
        orig_options = (FileOptions *)&_FileOptions_default_instance_;
      }
      AllocateOptions(this,orig_options,local_160);
    }
    CrossLinkFile(this,local_160,proto);
    bVar7 = this->had_errors_;
    pFVar25 = extraout_RDX_00;
    if ((bool)bVar7 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_f0,this);
      pOVar31 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar31 !=
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pOVar19 = pOVar31;
          pFVar25 = (FileDescriptor *)(local_148 + 0x10);
          descriptor = pOVar19->original_options;
          this_05 = &pOVar19->options->super_MessageLite;
          local_f0._8_8_ = pOVar19;
          iVar8 = (*this_05->_vptr_MessageLite[0x17])(this_05);
          local_110._M_dataplus._M_p = (char *)0x14;
          local_148._0_8_ = pFVar25;
          local_148._0_8_ = std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_110);
          local_138[0]._M_allocated_capacity = local_110._M_dataplus._M_p;
          *(undefined8 *)local_148._0_8_ = 0x707265746e696e75;
          *(undefined8 *)(local_148._0_8_ + 8) = 0x706f5f6465746572;
          *(undefined4 *)(local_148._0_8_ + 0x10) = 0x6e6f6974;
          local_148._8_8_ = local_110._M_dataplus._M_p;
          *(FileDescriptor *)(local_148._0_8_ + (long)local_110._M_dataplus._M_p) =
               (FileDescriptor)0x0;
          pFVar20 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var,iVar8),(string *)local_148);
          if ((FileDescriptor *)local_148._0_8_ != pFVar25) {
            operator_delete((void *)local_148._0_8_,(ulong)(local_138[0]._M_allocated_capacity + 1))
            ;
          }
          if (pFVar20 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1740);
            pLVar21 = internal::LogMessage::operator<<
                                ((LogMessage *)local_148,
                                 "CHECK failed: uninterpreted_options_field != NULL: ");
            pLVar21 = internal::LogMessage::operator<<
                                (pLVar21,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar21);
            internal::LogMessage::~LogMessage((LogMessage *)local_148);
          }
          iVar8 = (*this_05->_vptr_MessageLite[0x16])(this_05);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x38))
                    ((long *)CONCAT44(extraout_var_00,iVar8),this_05,pFVar20);
          iVar8 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x17])(descriptor);
          local_110._M_dataplus._M_p = (pointer)0x14;
          local_148._0_8_ = pFVar25;
          local_148._0_8_ = std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_110);
          local_138[0]._M_allocated_capacity = local_110._M_dataplus._M_p;
          *(undefined8 *)local_148._0_8_ = 0x707265746e696e75;
          *(undefined8 *)(local_148._0_8_ + 8) = 0x706f5f6465746572;
          *(undefined4 *)(local_148._0_8_ + 0x10) = 0x6e6f6974;
          local_148._8_8_ = local_110._M_dataplus._M_p;
          *(FileDescriptor *)(local_148._0_8_ + (long)local_110._M_dataplus._M_p) =
               (FileDescriptor)0x0;
          pFVar20 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var_01,iVar8),(string *)local_148);
          if ((FileDescriptor *)local_148._0_8_ != pFVar25) {
            operator_delete((void *)local_148._0_8_,(ulong)(local_138[0]._M_allocated_capacity + 1))
            ;
          }
          if (pFVar20 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1748);
            pLVar21 = internal::LogMessage::operator<<
                                ((LogMessage *)local_148,
                                 "CHECK failed: original_uninterpreted_options_field != NULL: ");
            pLVar21 = internal::LogMessage::operator<<
                                (pLVar21,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar21);
            internal::LogMessage::~LogMessage((LogMessage *)local_148);
          }
          iVar8 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
          iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x30))
                            ((long *)CONCAT44(extraout_var_02,iVar8),descriptor,pFVar20);
          if (0 < iVar8) {
            iVar26 = 0;
            do {
              iVar9 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
              pDVar22 = (DescriptorPool *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 0x1a0))
                                  ((long *)CONCAT44(extraout_var_03,iVar9),descriptor,pFVar20,iVar26
                                  );
              lVar29 = __dynamic_cast(pDVar22,&Message::typeinfo,&UninterpretedOption::typeinfo,0);
              if (lVar29 == 0) {
                __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/casts.h"
                              ,0x5b,
                              "To google::protobuf::internal::down_cast(From *) [To = const google::protobuf::UninterpretedOption *, From = const google::protobuf::Message]"
                             );
              }
              auStack_e0._0_8_ = pDVar22;
              bVar6 = OptionInterpreter::InterpretSingleOption
                                ((OptionInterpreter *)local_f0,(Message *)this_05);
              if (!bVar6) {
                local_f0._8_8_ = (OptionsToInterpret *)0x0;
                auStack_e0._0_8_ = (DescriptorPool *)0x0;
                goto LAB_002e1880;
              }
              iVar26 = iVar26 + 1;
            } while (iVar8 != iVar26);
          }
          local_f0._8_8_ = (OptionsToInterpret *)0x0;
          auStack_e0._0_8_ = (DescriptorPool *)0x0;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          local_110._M_string_length = 0;
          local_110.field_2._M_local_buf[0] = '\0';
          bVar6 = MessageLite::AppendPartialToString(this_05,&local_110);
          if (!bVar6) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1765);
            pLVar21 = internal::LogMessage::operator<<
                                ((LogMessage *)local_148,
                                 "CHECK failed: options->AppendPartialToString(&buf): ");
            pLVar21 = internal::LogMessage::operator<<
                                (pLVar21,"Protocol message could not be serialized.");
            internal::LogFinisher::operator=((LogFinisher *)local_b0,pLVar21);
            internal::LogMessage::~LogMessage((LogMessage *)local_148);
          }
          bVar6 = MessageLite::ParsePartialFromString(this_05,&local_110);
          if (!bVar6) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1767);
            pLVar21 = internal::LogMessage::operator<<
                                ((LogMessage *)local_148,
                                 "CHECK failed: options->ParsePartialFromString(buf): ");
            pLVar21 = internal::LogMessage::operator<<
                                (pLVar21,"Protocol message serialized itself in invalid fashion.");
            internal::LogFinisher::operator=((LogFinisher *)local_b0,pLVar21);
            internal::LogMessage::~LogMessage((LogMessage *)local_148);
          }
          iVar8 = (*this_05->_vptr_MessageLite[8])(this_05);
          this_06 = local_f0._0_8_;
          if ((char)iVar8 == '\0') {
            (*this_05->_vptr_MessageLite[9])(local_b0);
            puVar23 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x3a8286);
            pFVar25 = (FileDescriptor *)(puVar23 + 2);
            if ((FileDescriptor *)*puVar23 == pFVar25) {
              local_138[0]._0_8_ = *(undefined8 *)pFVar25;
              local_138[0]._8_8_ = puVar23[3];
              local_148._0_8_ = (FileDescriptor *)(local_148 + 0x10);
            }
            else {
              local_138[0]._0_8_ = *(undefined8 *)pFVar25;
              local_148._0_8_ = (FileDescriptor *)*puVar23;
            }
            local_148._8_8_ = puVar23[1];
            *puVar23 = pFVar25;
            puVar23[1] = 0;
            *(undefined1 *)(puVar23 + 2) = 0;
            AddWarning((DescriptorBuilder *)this_06,&pOVar19->element_name,descriptor,OTHER,
                       (string *)local_148);
            if ((FileDescriptor *)local_148._0_8_ != (FileDescriptor *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_,
                              (ulong)(local_138[0]._M_allocated_capacity + 1));
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,
                            CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                     local_110.field_2._M_local_buf[0]) + 1);
          }
LAB_002e1880:
          pOVar31 = pOVar19 + 1;
        } while (pOVar31 !=
                 (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        pOVar3 = (this->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar31 != pOVar3) {
          paVar30 = &(pOVar3->element_name).field_2;
          do {
            plVar4 = (long *)(((string *)(paVar30 + -1))->_M_dataplus)._M_p;
            if (paVar30 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar4) {
              operator_delete(plVar4,paVar30->_M_allocated_capacity + 1);
            }
            if (paVar30 + -2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar30[-3]._M_allocated_capacity) {
              operator_delete((long *)paVar30[-3]._M_allocated_capacity,
                              paVar30[-2]._M_allocated_capacity + 1);
            }
            pOVar31 = (pointer)(paVar30 + -3);
            paVar30 = paVar30 + 5;
          } while (pOVar31 != pOVar19);
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish = pOVar3;
        }
      }
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)local_f0);
      bVar7 = this->had_errors_;
      pFVar25 = extraout_RDX_01;
    }
    if (((bVar7 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,local_160,proto);
      bVar7 = this->had_errors_;
      pFVar25 = extraout_RDX_02;
    }
    if (((bVar7 & 1) != 0) && (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_))
    {
      lVar29 = 0;
      lVar32 = 0;
      do {
        lVar5 = *(long *)(local_160 + 0x60);
        pTVar18 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar32);
        DetectMapConflicts(this,(Descriptor *)(lVar5 + lVar29),pTVar18);
        lVar32 = lVar32 + 1;
        lVar29 = lVar29 + 0xa8;
        pFVar25 = extraout_RDX_03;
      } while (lVar32 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,pFVar25);
    }
    if (this->had_errors_ == true) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_002e199c:
      local_160 = (FileDescriptor *)0x0;
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      local_160[0xb8] = (FileDescriptor)0x1;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    local_160 = (FileDescriptor *)0x0;
  }
  return local_160;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const string*>(proto.dependency_size());
    memset(result->dependencies_names_, 0,
           sizeof(*result->dependencies_names_) * proto.dependency_size());
  } else {
    result->dependencies_once_ = NULL;
    result->dependencies_names_ = NULL;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      tables_->RollbackToLastCheckpoint();
      return NULL;
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_ ||
          (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
        dependency =
            pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
      } else {
        if (!pool_->lazily_build_dependencies_) {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    return result;
  }
}